

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall lattice::graph::print(graph *this,ostream *os)

{
  pointer psVar1;
  pointer in_RAX;
  ostream *poVar2;
  size_t k;
  ulong uVar3;
  size_t s;
  ulong uVar4;
  pointer local_38;
  
  local_38 = in_RAX;
  poVar2 = std::operator<<(os,"dimension: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"number of sites: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"number of bonds: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->sites_).
                             super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->sites_).
                            super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<(os,"site: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," type: ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,
                        (this->sites_).
                        super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4].type);
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = std::operator<<(poVar2,"( ");
    local_38 = (this->coordinates_).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_38);
    std::operator<<(poVar2," ) neighbors[ ");
    for (uVar3 = 0;
        psVar1 = (this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)*(pointer *)
                               ((long)&psVar1[uVar4].neighbors.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl + 8) -
                        *(long *)&psVar1[uVar4].neighbors.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::operator<<(poVar2,' ');
    }
    std::operator<<(os,"] neighbor_bonds[ ");
    for (uVar3 = 0;
        psVar1 = (this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)*(pointer *)
                               ((long)&psVar1[uVar4].neighbors.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl + 8) -
                        *(long *)&psVar1[uVar4].neighbors.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::operator<<(poVar2,' ');
    }
    std::operator<<(os,"]\n");
  }
  return;
}

Assistant:

void print(std::ostream& os = std::cout) const {
    os << "dimension: " << dimension() << std::endl
       << "number of sites: " << num_sites() << std::endl
       << "number of bonds: " << num_bonds() << std::endl;
    for (std::size_t s = 0; s < num_sites(); ++s) {
      os << "site: " << s << " type: " << site_type(s) << ' '
         << "( " << coordinate(s).transpose() << " ) neighbors[ ";
      for (std::size_t k = 0; k < num_neighbors(s); ++k)
        os << neighbor(s, k) << ' ';
      os << "] neighbor_bonds[ ";
      for (std::size_t k = 0; k < num_neighbors(s); ++k)
        os << neighbor_bond(s, k) << ' ';
      os << "]\n";
    }
  }